

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.cpp
# Opt level: O0

bool __thiscall
arangodb::velocypack::Builder::checkAttributeUniquenessUnsorted(Builder *this,Slice obj)

{
  ValueLength VVar1;
  undefined8 in_RSI;
  ObjectIterator *in_stack_00000008;
  ObjectIterator it;
  Slice in_stack_ffffffffffffffc8;
  Slice in_stack_ffffffffffffffd0;
  bool local_1;
  
  ObjectIterator::ObjectIterator
            ((ObjectIterator *)in_stack_ffffffffffffffc8._start,in_stack_ffffffffffffffd0,
             SUB81((ulong)in_RSI >> 0x38,0));
  VVar1 = ObjectIterator::size((ObjectIterator *)&stack0xffffffffffffffc8);
  if (VVar1 < 5) {
    local_1 = anon_unknown.dwarf_98ff::checkAttributeUniquenessUnsortedBrute
                        ((ObjectIterator *)obj._start);
  }
  else {
    local_1 = anon_unknown.dwarf_98ff::checkAttributeUniquenessUnsortedSet(in_stack_00000008);
  }
  return local_1;
}

Assistant:

bool Builder::checkAttributeUniquenessUnsorted(Slice obj) const {
  // cutoff value for linear attribute uniqueness scan
  // unsorted objects with this amount of attributes (or less) will
  // be validated using a non-allocating scan over the attributes
  // objects with more attributes will use a validation routine that
  // will use an std::unordered_set for O(1) lookups but with heap
  // allocations
  ObjectIterator it(obj, true);

  if (it.size() <= ::linearAttributeUniquenessCutoff) {
    return ::checkAttributeUniquenessUnsortedBrute(it);
  }
  return ::checkAttributeUniquenessUnsortedSet(it);
}